

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_8tap_8x2_half_pel_avx2(int16_t *src,__m256i *coeffs,__m256i *s_256,__m256i *r)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 (*in_RDX) [32];
  long in_RDI;
  __m256i ss_256 [4];
  __m256i a_256 [4];
  
  uVar6 = *(undefined8 *)(in_RDI + 0x68);
  uVar7 = *(undefined8 *)(in_RDI + 0x70);
  uVar8 = *(undefined8 *)(in_RDI + 0x78);
  *(undefined8 *)in_RDX[6] = *(undefined8 *)(in_RDI + 0x60);
  *(undefined8 *)(in_RDX[6] + 8) = uVar6;
  *(undefined8 *)(in_RDX[6] + 0x10) = uVar7;
  *(undefined8 *)(in_RDX[6] + 0x18) = uVar8;
  uVar6 = *(undefined8 *)(in_RDI + 0x78);
  uVar7 = *(undefined8 *)(in_RDI + 0x80);
  uVar8 = *(undefined8 *)(in_RDI + 0x88);
  *(undefined8 *)in_RDX[7] = *(undefined8 *)(in_RDI + 0x70);
  *(undefined8 *)(in_RDX[7] + 8) = uVar6;
  *(undefined8 *)(in_RDX[7] + 0x10) = uVar7;
  *(undefined8 *)(in_RDX[7] + 0x18) = uVar8;
  auVar1 = vpaddw_avx2(*in_RDX,in_RDX[7]);
  auVar2 = vpaddw_avx2(in_RDX[1],in_RDX[6]);
  auVar3 = vpaddw_avx2(in_RDX[2],in_RDX[5]);
  auVar4 = vpaddw_avx2(in_RDX[3],in_RDX[4]);
  auVar5 = vpunpcklwd_avx2(auVar1,auVar2);
  vpunpcklwd_avx2(auVar3,auVar4);
  vpunpckhwd_avx2(auVar1,auVar2);
  vpunpckhwd_avx2(auVar3,auVar4);
  xy_y_convolve_4tap_16_avx2(auVar5._8_8_,auVar5._0_8_,(__m256i *)0x9c44a0);
  uVar6 = *(undefined8 *)(in_RDX[2] + 8);
  uVar7 = *(undefined8 *)(in_RDX[2] + 0x10);
  uVar8 = *(undefined8 *)(in_RDX[2] + 0x18);
  *(undefined8 *)*in_RDX = *(undefined8 *)in_RDX[2];
  *(undefined8 *)(*in_RDX + 8) = uVar6;
  *(undefined8 *)(*in_RDX + 0x10) = uVar7;
  *(undefined8 *)(*in_RDX + 0x18) = uVar8;
  uVar6 = *(undefined8 *)(in_RDX[3] + 8);
  uVar7 = *(undefined8 *)(in_RDX[3] + 0x10);
  uVar8 = *(undefined8 *)(in_RDX[3] + 0x18);
  *(undefined8 *)in_RDX[1] = *(undefined8 *)in_RDX[3];
  *(undefined8 *)(in_RDX[1] + 8) = uVar6;
  *(undefined8 *)(in_RDX[1] + 0x10) = uVar7;
  *(undefined8 *)(in_RDX[1] + 0x18) = uVar8;
  uVar6 = *(undefined8 *)(in_RDX[4] + 8);
  uVar7 = *(undefined8 *)(in_RDX[4] + 0x10);
  uVar8 = *(undefined8 *)(in_RDX[4] + 0x18);
  *(undefined8 *)in_RDX[2] = *(undefined8 *)in_RDX[4];
  *(undefined8 *)(in_RDX[2] + 8) = uVar6;
  *(undefined8 *)(in_RDX[2] + 0x10) = uVar7;
  *(undefined8 *)(in_RDX[2] + 0x18) = uVar8;
  uVar6 = *(undefined8 *)(in_RDX[5] + 8);
  uVar7 = *(undefined8 *)(in_RDX[5] + 0x10);
  uVar8 = *(undefined8 *)(in_RDX[5] + 0x18);
  *(undefined8 *)in_RDX[3] = *(undefined8 *)in_RDX[5];
  *(undefined8 *)(in_RDX[3] + 8) = uVar6;
  *(undefined8 *)(in_RDX[3] + 0x10) = uVar7;
  *(undefined8 *)(in_RDX[3] + 0x18) = uVar8;
  uVar6 = *(undefined8 *)(in_RDX[6] + 8);
  uVar7 = *(undefined8 *)(in_RDX[6] + 0x10);
  uVar8 = *(undefined8 *)(in_RDX[6] + 0x18);
  *(undefined8 *)in_RDX[4] = *(undefined8 *)in_RDX[6];
  *(undefined8 *)(in_RDX[4] + 8) = uVar6;
  *(undefined8 *)(in_RDX[4] + 0x10) = uVar7;
  *(undefined8 *)(in_RDX[4] + 0x18) = uVar8;
  uVar6 = *(undefined8 *)(in_RDX[7] + 8);
  uVar7 = *(undefined8 *)(in_RDX[7] + 0x10);
  uVar8 = *(undefined8 *)(in_RDX[7] + 0x18);
  *(undefined8 *)in_RDX[5] = *(undefined8 *)in_RDX[7];
  *(undefined8 *)(in_RDX[5] + 8) = uVar6;
  *(undefined8 *)(in_RDX[5] + 0x10) = uVar7;
  *(undefined8 *)(in_RDX[5] + 0x18) = uVar8;
  return;
}

Assistant:

static inline void xy_y_convolve_8tap_8x2_half_pel_avx2(
    const int16_t *const src, const __m256i coeffs[2], __m256i s_256[8],
    __m256i r[2]) {
  __m256i a_256[4], ss_256[4];

  s_256[6] = _mm256_loadu_si256((__m256i *)(src + 6 * 8));
  s_256[7] = _mm256_loadu_si256((__m256i *)(src + 7 * 8));
  a_256[0] = _mm256_add_epi16(s_256[0], s_256[7]);
  a_256[1] = _mm256_add_epi16(s_256[1], s_256[6]);
  a_256[2] = _mm256_add_epi16(s_256[2], s_256[5]);
  a_256[3] = _mm256_add_epi16(s_256[3], s_256[4]);
  ss_256[0] = _mm256_unpacklo_epi16(a_256[0], a_256[1]);
  ss_256[1] = _mm256_unpacklo_epi16(a_256[2], a_256[3]);
  ss_256[2] = _mm256_unpackhi_epi16(a_256[0], a_256[1]);
  ss_256[3] = _mm256_unpackhi_epi16(a_256[2], a_256[3]);
  xy_y_convolve_4tap_16_avx2(ss_256, coeffs, r);
  s_256[0] = s_256[2];
  s_256[1] = s_256[3];
  s_256[2] = s_256[4];
  s_256[3] = s_256[5];
  s_256[4] = s_256[6];
  s_256[5] = s_256[7];
}